

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transformer.cpp
# Opt level: O0

unique_ptr<verilogAST::Reg,_std::default_delete<verilogAST::Reg>_> __thiscall
verilogAST::Transformer::visit
          (Transformer *this,
          unique_ptr<verilogAST::Reg,_std::default_delete<verilogAST::Reg>_> *node)

{
  pointer pRVar1;
  unique_ptr<verilogAST::Reg,_std::default_delete<verilogAST::Reg>_> *in_RDX;
  variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Index,_std::default_delete<verilogAST::Index>_>,_std::unique_ptr<verilogAST::Slice,_std::default_delete<verilogAST::Slice>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
  local_40;
  variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Index,_std::default_delete<verilogAST::Index>_>,_std::unique_ptr<verilogAST::Slice,_std::default_delete<verilogAST::Slice>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
  local_30;
  unique_ptr<verilogAST::Reg,_std::default_delete<verilogAST::Reg>_> *node_local;
  Transformer *this_local;
  
  node_local = node;
  this_local = this;
  pRVar1 = std::unique_ptr<verilogAST::Reg,_std::default_delete<verilogAST::Reg>_>::operator->
                     (in_RDX);
  std::
  variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Index,_std::default_delete<verilogAST::Index>_>,_std::unique_ptr<verilogAST::Slice,_std::default_delete<verilogAST::Slice>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
  ::variant(&local_40,
            (variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Index,_std::default_delete<verilogAST::Index>_>,_std::unique_ptr<verilogAST::Slice,_std::default_delete<verilogAST::Slice>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
             *)(pRVar1 + 0x28));
  visit<std::variant<std::unique_ptr<verilogAST::Identifier,std::default_delete<verilogAST::Identifier>>,std::unique_ptr<verilogAST::Index,std::default_delete<verilogAST::Index>>,std::unique_ptr<verilogAST::Slice,std::default_delete<verilogAST::Slice>>,std::unique_ptr<verilogAST::Vector,std::default_delete<verilogAST::Vector>>>>
            (&local_30,(Transformer *)node,&local_40);
  pRVar1 = std::unique_ptr<verilogAST::Reg,_std::default_delete<verilogAST::Reg>_>::operator->
                     (in_RDX);
  std::
  variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Index,_std::default_delete<verilogAST::Index>_>,_std::unique_ptr<verilogAST::Slice,_std::default_delete<verilogAST::Slice>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
  ::operator=((variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Index,_std::default_delete<verilogAST::Index>_>,_std::unique_ptr<verilogAST::Slice,_std::default_delete<verilogAST::Slice>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
               *)(pRVar1 + 0x28),&local_30);
  std::
  variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Index,_std::default_delete<verilogAST::Index>_>,_std::unique_ptr<verilogAST::Slice,_std::default_delete<verilogAST::Slice>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
  ::~variant(&local_30);
  std::
  variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Index,_std::default_delete<verilogAST::Index>_>,_std::unique_ptr<verilogAST::Slice,_std::default_delete<verilogAST::Slice>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
  ::~variant(&local_40);
  std::unique_ptr<verilogAST::Reg,_std::default_delete<verilogAST::Reg>_>::unique_ptr
            ((unique_ptr<verilogAST::Reg,_std::default_delete<verilogAST::Reg>_> *)this,in_RDX);
  return (__uniq_ptr_data<verilogAST::Reg,_std::default_delete<verilogAST::Reg>,_true,_true>)
         (__uniq_ptr_data<verilogAST::Reg,_std::default_delete<verilogAST::Reg>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Reg> Transformer::visit(std::unique_ptr<Reg> node) {
  node->value = this->visit(std::move(node->value));
  return node;
}